

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall file_base_1::test_method(file_base_1 *this)

{
  int iVar1;
  char *pcVar2;
  const_string local_d0;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  char **local_a8;
  assertion_result local_a0;
  undefined **local_88;
  undefined1 local_80;
  undefined1 *local_78;
  char ***local_70;
  lazy_ostream local_68;
  undefined1 *local_58;
  char *local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x19;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string("a");
  local_38 = assert_hash::details::file_base_impl("a",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,"a");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_70 = &local_48;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  local_40 = "a";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8a00;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x19,CHECK,CHECK_EQUAL,2,"ah::file_base( \"a\", 1 )",
             &local_88,"\"a\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1a;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string("a.txt");
  local_38 = assert_hash::details::file_base_impl("a.txt",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,"a.txt");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_48;
  local_40 = "a.txt";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8a40;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x1a,CHECK,CHECK_EQUAL,2,"ah::file_base( \"a.txt\", 1 )",
             &local_88,"\"a.txt\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1b;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string(".a.txt");
  local_38 = assert_hash::details::file_base_impl(".a.txt",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,".a.txt");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_48;
  local_40 = ".a.txt";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8a80;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x1b,CHECK,CHECK_EQUAL,2,"ah::file_base( \".a.txt\", 1 )"
             ,&local_88,"\".a.txt\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1c;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string("dev/null");
  local_38 = assert_hash::details::file_base_impl("dev/null",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,"/null");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_48;
  local_40 = "/null";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8a40;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x1c,CHECK,CHECK_EQUAL,2,
             "ah::file_base( \"dev/null\", 1 )",&local_88,"\"/null\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1d;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string("/Users/todi/assert_hash/build");
  local_38 = assert_hash::details::file_base_impl("/Users/todi/assert_hash/build",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,"/build");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_48;
  local_40 = "/build";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8a80;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x1d,CHECK,CHECK_EQUAL,2,
             "ah::file_base( \"/Users/todi/assert_hash/build\", 1 )",&local_88,"\"/build\"",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e;
  local_68.m_empty = false;
  local_68._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = "";
  pcVar2 = assert_hash::details::end_of_string("c:\\asda\\asdasd\\asd\\.a.txt");
  local_38 = assert_hash::details::file_base_impl("c:\\asda\\asdasd\\asd\\.a.txt",pcVar2,1);
  if (local_38 == (char *)0x0) {
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    iVar1 = strcmp(local_38,"\\.a.txt");
    local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
  }
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_38;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_001b89c0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_48;
  local_40 = "\\.a.txt";
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8b80;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,&local_68,&local_d0,0x1e,CHECK,CHECK_EQUAL,2,
             "ah::file_base( \"c:\\\\asda\\\\asdasd\\\\asd\\\\.a.txt\", 1 )",&local_88,
             "\"\\\\.a.txt\"",&local_c0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_1 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a", 1 ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt", 1 ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt", 1 ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "dev/null", 1 ), "/null" );
    BOOST_CHECK_EQUAL( ah::file_base( "/Users/todi/assert_hash/build", 1 ), "/build" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asda\\asdasd\\asd\\.a.txt", 1 ), "\\.a.txt" );
}